

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::SetInlineSlot
          (DynamicTypeHandler *this,DynamicObject *instance,PropertyId propertyId,bool allowLetConst
          ,int index,Var value)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  uint uVar5;
  undefined4 *puVar6;
  Type *slots;
  Var value_local;
  int index_local;
  bool allowLetConst_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  bVar3 = ThreadContext::IsOnStack(instance);
  if (((!bVar3) && (bVar3 = ThreadContext::IsOnStack(value), bVar3)) &&
     (bVar3 = TaggedNumber::Is(value), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x9f,
                                "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                ,
                                "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (index < (int)(uint)(this->offsetOfInlineSlots >> 3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xa0,"(index >= (int)(offsetOfInlineSlots / sizeof(Var)))",
                                "index should be relative to the address of the object");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar1 = this->offsetOfInlineSlots;
  uVar4 = GetInlineSlotCapacity(this);
  if ((int)(uint)uVar4 <= (int)(index - (uint)(uVar1 >> 3))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xa1,
                                "(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity())"
                                ,
                                "index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((propertyId != -1) &&
     (uVar5 = (*this->_vptr_DynamicTypeHandler[0x56])
                        (this,instance,(ulong)(uint)propertyId,(ulong)allowLetConst),
     (uVar5 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xa2,
                                "(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst))"
                                ,
                                "propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)
             (&(instance->super_RecyclableObject).super_FinalizableObject + index),value);
  return;
}

Assistant:

void DynamicTypeHandler::SetInlineSlot(DynamicObject* instance, int index, Var value)
#endif
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        AssertMsg(index >= (int)(offsetOfInlineSlots / sizeof(Var)), "index should be relative to the address of the object");
        Assert(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity());
        Assert(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst));

        Field(Var) * slots = reinterpret_cast<Field(Var)*>(instance);
        slots[index] = value;
    }